

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O1

uint __thiscall llvm::AArch64::getDefaultExtensions(AArch64 *this,StringRef CPU,ArchKind AK)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  bool bVar4;
  bool bVar5;
  
  pcVar3 = CPU.Data;
  if (pcVar3 == (char *)0xa) {
    bVar4 = *(short *)(this + 8) == 0x3533 && *(long *)this == 0x612d786574726f63;
  }
  else {
    if ((pcVar3 == (char *)0x7) && (*(int *)(this + 3) == 0x63697265 && *(int *)this == 0x656e6567))
    {
      return *(uint *)(&DAT_00206da4 + (CPU.Length & 0xffffffff) * 0x40);
    }
    bVar4 = false;
  }
  if ((pcVar3 == (char *)0xa) && (!bVar4)) {
    bVar4 = true;
    if (*(short *)(this + 8) != 0x3335 || *(long *)this != 0x612d786574726f63) {
      bVar4 = false;
    }
  }
  uVar2 = 0x1e;
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x3535 && *(long *)this == 0x612d786574726f63;
    }
    else {
      bVar5 = false;
    }
    uVar2 = 0x1e;
    if (bVar5) {
      uVar2 = 0x1dbe;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x3735 && *(long *)this == 0x612d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x1e;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x3237 && *(long *)this == 0x612d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x1e;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x3337 && *(long *)this == 0x612d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x1e;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xa) {
      bVar5 = *(short *)(this + 8) == 0x3537 && *(long *)this == 0x612d786574726f63;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x1dbe;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x7) {
      bVar5 = *(int *)(this + 3) == 0x656e6f6c && *(int *)this == 0x6c637963;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x1d;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (AArch64)0x31 && *(long *)this == 0x6d2d736f6e797865;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x1e;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (AArch64)0x32 && *(long *)this == 0x6d2d736f6e797865;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x1e;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (AArch64)0x33 && *(long *)this == 0x6d2d736f6e797865;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x1e;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x9) {
      bVar5 = this[8] == (AArch64)0x34 && *(long *)this == 0x6d2d736f6e797865;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x1e;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x6) {
      bVar5 = *(short *)(this + 4) == 0x726f && *(int *)this == 0x6b6c6166;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x101e;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x7) {
      bVar5 = *(int *)(this + 3) == 0x61726968 && *(int *)this == 0x68706173;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x19de;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x4) {
      bVar5 = *(int *)this == 0x6f79726b;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x1e;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xc) {
      bVar5 = *(int *)(this + 8) == 0x39397432 && *(long *)this == 0x787265646e756874;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x111f;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x8) {
      bVar5 = *(long *)this == 0x787265646e756874;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x5e;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xb) {
      bVar5 = *(long *)(this + 3) == 0x383874787265646e && *(long *)this == 0x787265646e756874;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x5e;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xb) {
      bVar5 = *(long *)(this + 3) == 0x313874787265646e && *(long *)this == 0x787265646e756874;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x5e;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0xb) {
      bVar5 = *(long *)(this + 3) == 0x333874787265646e && *(long *)this == 0x787265646e756874;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 0x5e;
    }
    bVar4 = true;
    if (!bVar5) {
      bVar4 = false;
    }
  }
  if (!bVar4) {
    if (pcVar3 == (char *)0x7) {
      bVar5 = *(int *)(this + 3) == 0x64696c61 && *(int *)this == 0x61766e69;
    }
    else {
      bVar5 = false;
    }
    if (bVar5) {
      uVar2 = 1;
    }
    bVar4 = false;
    if (bVar5) {
      bVar4 = true;
    }
  }
  uVar1 = 0;
  if (bVar4) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

unsigned llvm::AArch64::getDefaultExtensions(StringRef CPU, ArchKind AK) {
  if (CPU == "generic")
    return AArch64ARCHNames[static_cast<unsigned>(AK)].ArchBaseExtensions;

  return StringSwitch<unsigned>(CPU)
#define AARCH64_CPU_NAME(NAME, ID, DEFAULT_FPU, IS_DEFAULT, DEFAULT_EXT)       \
  .Case(NAME,                                                                  \
        AArch64ARCHNames[static_cast<unsigned>(AArch64::ArchKind::ID)] \
            .ArchBaseExtensions | \
            DEFAULT_EXT)
#include "llvm/Support/AArch64TargetParser.def"
    .Default(AArch64::AEK_INVALID);
}